

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O3

void __thiscall MathInterpreter::~MathInterpreter(MathInterpreter *this)

{
  this->input = (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0;
  this->operator_stack =
       (stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)0x0;
  this->postfix_expression =
       (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  return;
}

Assistant:

MathInterpreter::~MathInterpreter() {
  if (this->input == nullptr) {
    delete this->input;
  }
  this->input = nullptr;
  if (this->operator_stack == nullptr) {
    delete this->operator_stack;
  }
  this->operator_stack = nullptr;
  if (this->postfix_expression == nullptr) {
    delete this->postfix_expression;
  }
  this->postfix_expression = nullptr;

}